

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int *nr,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *val,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *stab,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max)

{
  int iVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *f;
  cpp_dec_float<200U,_int,_void> *this_00;
  int *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int indp;
  int indc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000002c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000002d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000002d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000002e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000002e8;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000002f0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000005a0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000005a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000005b0;
  int in_stack_000005b8;
  int in_stack_000005c0;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd48;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd50;
  double in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffd6c;
  undefined1 local_228 [128];
  int local_1a8;
  undefined1 local_1a4 [4];
  double in_stack_fffffffffffffe60;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffe68;
  undefined8 local_120;
  undefined1 local_118 [136];
  undefined8 local_90;
  int *local_78;
  DataKey local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined1 *local_40;
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  
  local_90 = in_R8;
  local_78 = in_RSI;
  local_58 = infinity();
  local_50 = local_118;
  local_60 = 0;
  local_28 = local_58;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,in_stack_fffffffffffffd50);
  local_120 = 0;
  local_18 = local_90;
  local_20 = &local_120;
  local_10 = local_20;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  *(undefined1 *)(in_RDI + 0x230) = 1;
  local_40 = local_1a4;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  f = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::coPvec(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(in_RDI + 8));
  this_00 = (cpp_dec_float<200U,_int,_void> *)
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::lcBound(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        **)(in_RDI + 8));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::ucBound(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              **)(in_RDI + 8));
  iVar1 = minSelect(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,
                    in_stack_000002d0,in_stack_000002c8,in_stack_000005a0,in_stack_000005a8,
                    in_stack_000005b0,in_stack_000005b8,in_stack_000005c0);
  *(undefined1 *)(in_RDI + 0x230) = 0;
  local_30 = local_228;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (this_00,(cpp_dec_float<200U,_int,_void> *)f);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::pVec(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           **)(in_RDI + 8));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::lpBound(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              **)(in_RDI + 8));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::upBound(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              **)(in_RDI + 8));
  uVar2 = 1;
  local_1a8 = minSelect(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,
                        in_stack_000002d0,in_stack_000002c8,in_stack_000005a0,in_stack_000005a8,
                        in_stack_000005b0,in_stack_000005b8,in_stack_000005c0);
  if (local_1a8 < 0) {
    if (iVar1 < 0) {
      *local_78 = -1;
      SPxId::SPxId((SPxId *)0x796a34);
    }
    else {
      *local_78 = iVar1;
      local_68 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_fffffffffffffd6c,uVar2),
                                 in_stack_fffffffffffffd64);
    }
  }
  else {
    *local_78 = local_1a8;
    local_68 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_fffffffffffffd6c,uVar2),in_stack_fffffffffffffd64)
    ;
  }
  return (SPxId)local_68;
}

Assistant:

SPxId SPxFastRT<R>::minSelect(
   int& nr,
   R& val,
   R& stab,
   R& bestDelta,
   R max)
{
   R best = R(infinity);
   bestDelta = 0.0;
   iscoid = true;
   int indc = minSelect(val, stab, best, bestDelta, max,
                        this->thesolver->coPvec(), this->thesolver->lcBound(), this->thesolver->ucBound(), 0, 1);
   iscoid = false;
   int indp = minSelect(val, stab, best, bestDelta, max,
                        this->thesolver->pVec(), this->thesolver->lpBound(), this->thesolver->upBound(), 0, 1);

   if(indp >= 0)
   {
      nr = indp;
      return this->thesolver->id(indp);
   }

   if(indc >= 0)
   {
      nr = indc;
      return this->thesolver->coId(indc);
   }

   nr = -1;
   return SPxId();
}